

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall czh::lexer::NumberMatch::next(NumberMatch *this,Token *token)

{
  State SVar1;
  undefined *puVar2;
  State SVar3;
  Token TVar4;
  ulong uVar5;
  
  SVar1 = UNEXPECTED;
  switch(this->state) {
  case INIT:
    uVar5 = (ulong)*token;
    if (uVar5 < 3) {
      puVar2 = &DAT_0015c168;
LAB_0011892d:
      SVar1 = *(State *)(puVar2 + uVar5 * 4);
    }
    break;
  case INT:
    switch(*token) {
    case INT:
      goto switchD_00118983_caseD_0;
    case DOT:
      SVar1 = DOT;
      break;
    case EXP:
switchD_00118983_caseD_3:
      SVar1 = EXP;
      break;
    case END:
      goto switchD_00118983_caseD_5;
    }
    break;
  case INT_DOT:
    TVar4 = *token;
    if (TVar4 == INT) {
      return;
    }
    if (TVar4 == EXP) goto switchD_00118983_caseD_3;
    goto LAB_001189ba;
  case SIGN:
    TVar4 = *token;
    SVar3 = (uint)(TVar4 != DOT) * 5 + DOT_NO_INT;
    SVar1 = INT;
    goto LAB_001189ae;
  case DOT:
    uVar5 = (ulong)*token;
    if (uVar5 < 6) {
      puVar2 = &DAT_0015c174;
      goto LAB_0011892d;
    }
    break;
  case DOT_NO_INT:
    SVar1 = (uint)(*token != INT) * 8 + INT_DOT;
    break;
  case EXP:
    TVar4 = *token;
    SVar3 = (uint)(TVar4 != SIGN) * 3 + EXP_SIGN;
    SVar1 = EXP_INT;
LAB_001189ae:
    if (TVar4 != INT) {
      SVar1 = SVar3;
    }
    break;
  case EXP_SIGN:
    SVar1 = (uint)(*token != INT) * 2 + EXP_INT;
    break;
  case EXP_INT:
    TVar4 = *token;
    if (TVar4 == INT) {
      return;
    }
LAB_001189ba:
    if (TVar4 == END) {
switchD_00118983_caseD_5:
      SVar1 = END;
    }
  }
  this->state = SVar1;
switchD_00118983_caseD_0:
  return;
}

Assistant:

void next(const Token &token)
    {
      switch (state)
      {
        case State::INIT:
          switch (token)
          {
            case Token::INT:
              state = State::INT;
              break;
            case Token::DOT:
              state = State::DOT_NO_INT;
              break;
            case Token::SIGN:
              state = State::SIGN;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::SIGN:
          switch (token)
          {
            case Token::INT:
              state = State::INT;
              break;
            case Token::DOT:
              state = State::DOT_NO_INT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::INT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::DOT:
              state = State::DOT;
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::INT_DOT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::DOT_NO_INT:
          switch (token)
          {
            case Token::INT:
              state = State::INT_DOT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::DOT:
          switch (token)
          {
            case Token::INT:
              state = State::INT_DOT;
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP:
          switch (token)
          {
            case Token::INT:
              state = State::EXP_INT;
              break;
            case Token::SIGN:
              state = State::EXP_SIGN;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP_SIGN:
          switch (token)
          {
            case Token::INT:
              state = State::EXP_INT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP_INT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        default:
          state = State::UNEXPECTED;
          break;
      }
    }